

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstracteventdispatcher.cpp
# Opt level: O2

int __thiscall
QAbstractEventDispatcherV2::remainingTime(QAbstractEventDispatcherV2 *this,int timerId)

{
  long lVar1;
  undefined4 in_register_00000034;
  
  lVar1 = (**(code **)(*(long *)this + 0xd8))(this,CONCAT44(in_register_00000034,timerId));
  lVar1 = lVar1 / 1000000 + (ulong)((lVar1 / 1000000) * 1000000 < lVar1);
  if (0x7ffffffe < lVar1) {
    lVar1 = 0x7fffffff;
  }
  if (lVar1 < -0x7fffffff) {
    lVar1 = -0x80000000;
  }
  return (int)lVar1;
}

Assistant:

int QAbstractEventDispatcherV2::remainingTime(int timerId)
{
    auto self = static_cast<QAbstractEventDispatcherV2 *>(this);
    return fromDuration<int>(self->remainingTime(Qt::TimerId(timerId)));
}